

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O1

void __thiscall QWizardPrivate::recreateLayout(QWizardPrivate *this,QWizardLayoutInfo *info)

{
  WizardStyle WVar1;
  long lVar2;
  QWizardRuler *pQVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int *piVar7;
  QPalettePrivate *pQVar8;
  Representation RVar9;
  int iVar10;
  uint columnSpan;
  long *plVar11;
  long lVar12;
  QObject *pQVar13;
  QWizardHeader *pQVar14;
  QWidget *pQVar15;
  QPalette *pQVar16;
  QLabel *pQVar17;
  QSpacerItem *this_00;
  QWatermarkLabel *pQVar18;
  bool bVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  int iVar23;
  int iVar24;
  Weight WVar25;
  ColorGroup CVar26;
  QLayout *pQVar27;
  uint uVar28;
  int iVar29;
  uint right;
  int iVar30;
  long in_FS_OFFSET;
  QByteArrayView QVar31;
  QBrush local_90 [8];
  QColor local_88;
  undefined8 local_78;
  QPalettePrivate *local_68;
  undefined1 *puStack_60;
  undefined1 local_58 [8];
  undefined1 *puStack_50;
  undefined8 local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  iVar10 = (**(code **)(*(long *)&this->mainLayout->super_QLayout + 200))();
  if (0 < iVar10) {
    iVar10 = iVar10 + 1;
    do {
      plVar11 = (long *)(**(code **)(*(long *)&this->mainLayout->super_QLayout + 0xb0))
                                  (this->mainLayout,iVar10 + -2);
      lVar12 = (**(code **)(*plVar11 + 0x70))(plVar11);
      if (lVar12 == 0) {
        (**(code **)(*plVar11 + 8))(plVar11);
      }
      else {
        pQVar13 = (QObject *)(**(code **)(*plVar11 + 0x70))();
        QObject::setParent(pQVar13);
      }
      iVar10 = iVar10 + -1;
    } while (1 < iVar10);
  }
  iVar10 = QGridLayout::columnCount(this->mainLayout);
  if (0 < iVar10) {
    iVar10 = iVar10 + 1;
    do {
      QGridLayout::setColumnMinimumWidth(this->mainLayout,iVar10 + -2,0);
      iVar10 = iVar10 + -1;
    } while (1 < iVar10);
  }
  iVar10 = QGridLayout::rowCount(this->mainLayout);
  if (0 < iVar10) {
    iVar10 = iVar10 + 1;
    do {
      QGridLayout::setRowMinimumHeight(this->mainLayout,iVar10 + -2,0);
      iVar10 = iVar10 + -1;
    } while (1 < iVar10);
  }
  WVar1 = info->wizStyle;
  iVar10 = info->topLevelMarginBottom;
  columnSpan = 3;
  if ((WVar1 != MacStyle) && (columnSpan = 2, info->watermark == false)) {
    columnSpan = info->sideWidget + 1;
  }
  iVar20 = info->topLevelMarginLeft - info->childMarginLeft;
  uVar22 = iVar10 - info->childMarginBottom;
  iVar21 = iVar10 - info->vspacing;
  uVar28 = 2;
  if (columnSpan < 2) {
    uVar28 = columnSpan;
  }
  pQVar27 = &this->mainLayout->super_QLayout;
  if (WVar1 == MacStyle) {
    local_58 = (undefined1  [8])0x0;
    puStack_50 = (undefined1 *)0x0;
    QLayout::setContentsMargins(pQVar27,(QMargins *)local_58);
    (**(code **)(*(long *)&this->mainLayout->super_QLayout + 0x68))(this->mainLayout,0);
    QLayout::setContentsMargins((QLayout *)this->buttonLayout,0x14,0xd,0x14,0x11);
    pQVar27 = (QLayout *)this->pageVBoxLayout;
    iVar23 = 7;
    iVar10 = 7;
    iVar29 = 7;
    iVar30 = 7;
  }
  else {
    iVar23 = info->topLevelMarginRight;
    iVar29 = info->topLevelMarginTop;
    if (WVar1 == ModernStyle) {
      iVar10 = info->childMarginRight;
      iVar30 = info->childMarginTop;
      local_58 = (undefined1  [8])0x0;
      puStack_50 = (undefined1 *)0x0;
      QLayout::setContentsMargins(pQVar27,(QMargins *)local_58);
      (**(code **)(*(long *)&this->mainLayout->super_QLayout + 0x68))(this->mainLayout,0);
      QLayout::setContentsMargins
                ((QLayout *)this->pageVBoxLayout,iVar20,iVar29 - iVar30,iVar23 - iVar10,uVar22);
      pQVar27 = (QLayout *)this->buttonLayout;
      iVar10 = info->topLevelMarginTop;
      iVar23 = info->topLevelMarginLeft;
      iVar29 = info->topLevelMarginRight;
      iVar30 = info->topLevelMarginBottom;
    }
    else {
      QLayout::setContentsMargins(pQVar27,info->topLevelMarginLeft,iVar29,iVar23,iVar10);
      QGridLayout::setHorizontalSpacing(this->mainLayout,info->hspacing);
      QGridLayout::setVerticalSpacing(this->mainLayout,info->vspacing);
      QLayout::setContentsMargins((QLayout *)this->pageVBoxLayout,0,0,0,0);
      pQVar27 = (QLayout *)this->buttonLayout;
      iVar23 = 0;
      iVar10 = 0;
      iVar29 = 0;
      iVar30 = 0;
    }
  }
  QLayout::setContentsMargins(pQVar27,iVar23,iVar10,iVar29,iVar30);
  (**(code **)(*(long *)&(this->buttonLayout->super_QBoxLayout).super_QLayout + 0x68))();
  iVar10 = 0;
  if (info->header == true) {
    if (this->headerWidget == (QWizardHeader *)0x0) {
      pQVar14 = (QWizardHeader *)operator_new(0x60);
      QWizardHeader::QWizardHeader(pQVar14,&this->antiFlickerWidget->super_QWidget);
      this->headerWidget = pQVar14;
    }
    QWidget::setAutoFillBackground(&this->headerWidget->super_QWidget,WVar1 == ModernStyle);
    iVar10 = 1;
    QGridLayout::addWidget
              (this->mainLayout,&this->headerWidget->super_QWidget,0,0,1,columnSpan,(Alignment)0x0);
  }
  if (this->headerWidget != (QWizardHeader *)0x0) {
    (**(code **)(*(long *)&this->headerWidget->super_QWidget + 0x68))();
  }
  iVar23 = iVar10;
  if (WVar1 == MacStyle) {
    iVar23 = iVar10 + 1;
    QGridLayout::setRowMinimumHeight(this->mainLayout,iVar10,10);
  }
  iVar29 = uVar28 - 1;
  if (info->title != true) goto LAB_00515f39;
  if (this->titleLabel == (QLabel *)0x0) {
    pQVar15 = (QWidget *)operator_new(0x28);
    QLabel::QLabel((QLabel *)pQVar15,&this->antiFlickerWidget->super_QWidget,(WindowFlags)0x0);
    this->titleLabel = (QLabel *)pQVar15;
    QWidget::setBackgroundRole(pQVar15,Base);
    QLabel::setWordWrap(this->titleLabel,true);
  }
  local_68 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  QFont::QFont((QFont *)&local_68,(QFont *)(*(long *)(lVar2 + 0x20) + 0x38));
  QFont::pointSize();
  WVar25 = (Weight)(QFont *)&local_68;
  QFont::setPointSize(WVar25);
  QFont::setWeight(WVar25);
  pQVar15 = (QWidget *)this->titleLabel;
  QPalette::QPalette((QPalette *)local_58);
  QWidget::setPalette(pQVar15,(QPalette *)local_58);
  QPalette::~QPalette((QPalette *)local_58);
  if (WVar1 == AeroStyle) {
    QVar31.m_data = (storage_type *)0x8;
    QVar31.m_size = (qsizetype)local_58;
    QString::fromLatin1(QVar31);
    local_88.cspec = local_58._0_4_;
    local_88.ct._0_4_ = local_58._4_4_;
    local_88.ct._4_4_ = SUB84(puStack_50,0);
    local_88.ct.argb.pad = (ushort)((ulong)puStack_50 >> 0x20);
    local_88._14_2_ = SUB82((ulong)puStack_50 >> 0x30,0);
    local_78 = local_48;
    QFont::QFont((QFont *)local_58,(QString *)&local_88,0xc,-1,false);
    pQVar8 = local_68;
    local_68 = (QPalettePrivate *)local_58;
    local_58 = (undefined1  [8])pQVar8;
    RVar9.m_i = puStack_60._0_4_;
    puStack_60 = (undefined1 *)CONCAT44(puStack_60._4_4_,puStack_50._0_4_);
    puStack_50 = (undefined1 *)CONCAT44(puStack_50._4_4_,RVar9.m_i);
    QFont::~QFont((QFont *)local_58);
    piVar7 = (int *)CONCAT44(local_88.ct._0_4_,local_88.cspec);
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + -1;
      UNLOCK();
      if (*piVar7 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_88.ct._0_4_,local_88.cspec),2,0x10);
      }
    }
    local_58 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar16 = QWidget::palette((QWidget *)this->titleLabel);
    QPalette::QPalette((QPalette *)local_58,pQVar16);
    local_88.cspec = Rgb;
    local_88.ct._0_4_ = 0xffff;
    local_88.ct._4_4_ = 0x99993333;
    local_88.ct.argb.pad = 0;
    QBrush::QBrush(local_90,&local_88,SolidPattern);
    QPalette::setBrush((ColorGroup)(QPalette *)local_58,Mid,(QBrush *)0x6);
    QBrush::~QBrush(local_90);
    QWidget::setPalette((QWidget *)this->titleLabel,(QPalette *)local_58);
    QPalette::~QPalette((QPalette *)local_58);
    QWidget::setFont((QWidget *)this->titleLabel,(QFont *)&local_68);
    pQVar17 = this->titleLabel;
    iVar30 = 0x19;
LAB_00515dce:
    QLabel::setIndent(pQVar17,iVar30);
  }
  else {
    QWidget::setFont((QWidget *)this->titleLabel,(QFont *)&local_68);
    pQVar17 = this->titleLabel;
    if (WVar1 == MacStyle) {
      iVar30 = 2;
      goto LAB_00515dce;
    }
    if (WVar1 == ClassicStyle) {
      iVar30 = info->childMarginLeft;
    }
    else {
      iVar30 = info->topLevelMarginLeft;
    }
    QLabel::setIndent(pQVar17,iVar30);
  }
  iVar30 = iVar23;
  if (WVar1 == ModernStyle) {
    if (this->placeholderWidget1 == (QWidget *)0x0) {
      pQVar15 = (QWidget *)operator_new(0x28);
      QWidget::QWidget(pQVar15,&this->antiFlickerWidget->super_QWidget,(WindowFlags)0x0);
      this->placeholderWidget1 = pQVar15;
      QWidget::setBackgroundRole(pQVar15,Base);
    }
    QWidget::setFixedHeight(this->placeholderWidget1,info->topLevelMarginLeft + 2);
    iVar30 = iVar23 + 1;
    QGridLayout::addWidget(this->mainLayout,this->placeholderWidget1,iVar23,iVar29,(Alignment)0x0);
  }
  QGridLayout::addWidget(this->mainLayout,(QWidget *)this->titleLabel,iVar30,iVar29,(Alignment)0x0);
  iVar24 = iVar30 + 1;
  if (WVar1 == ModernStyle) {
    if (this->placeholderWidget2 == (QWidget *)0x0) {
      pQVar15 = (QWidget *)operator_new(0x28);
      QWidget::QWidget(pQVar15,&this->antiFlickerWidget->super_QWidget,(WindowFlags)0x0);
      this->placeholderWidget2 = pQVar15;
      QWidget::setBackgroundRole(pQVar15,Base);
    }
    QWidget::setFixedHeight(this->placeholderWidget2,5);
    iVar24 = iVar30 + 2;
    QGridLayout::addWidget
              (this->mainLayout,this->placeholderWidget2,iVar30 + 1,iVar29,(Alignment)0x0);
  }
  iVar23 = iVar24;
  if (WVar1 == MacStyle) {
    iVar23 = iVar24 + 1;
    QGridLayout::setRowMinimumHeight(this->mainLayout,iVar24,7);
  }
  QFont::~QFont((QFont *)&local_68);
LAB_00515f39:
  if (this->placeholderWidget1 != (QWidget *)0x0) {
    (**(code **)(*(long *)this->placeholderWidget1 + 0x68))();
  }
  if (this->placeholderWidget2 != (QWidget *)0x0) {
    (**(code **)(*(long *)this->placeholderWidget2 + 0x68))();
  }
  if ((info->subTitle == true) && (this->subTitleLabel == (QLabel *)0x0)) {
    pQVar17 = (QLabel *)operator_new(0x28);
    QLabel::QLabel(pQVar17,&this->pageFrame->super_QWidget,(WindowFlags)0x0);
    this->subTitleLabel = pQVar17;
    QLabel::setWordWrap(pQVar17,true);
    QWidget::setContentsMargins
              ((QWidget *)this->subTitleLabel,info->childMarginLeft,0,info->childMarginRight,0);
    QBoxLayout::insertWidget
              (&this->pageVBoxLayout->super_QBoxLayout,1,(QWidget *)this->subTitleLabel,0,
               (Alignment)0x0);
  }
  bVar19 = info->subTitle;
  iVar30 = info->childMarginLeft;
  plVar11 = (long *)(**(code **)(*(long *)&(this->pageVBoxLayout->super_QBoxLayout).super_QLayout +
                                0xa8))();
  this_00 = (QSpacerItem *)(**(code **)(*plVar11 + 0x78))(plVar11);
  if (this_00 != (QSpacerItem *)0x0) {
    if (bVar19 == false) {
      iVar30 = 0;
    }
    QSpacerItem::changeSize(this_00,0,iVar30,Minimum,Minimum);
  }
  uVar28 = (uint)(WVar1 == MacStyle);
  iVar30 = 0x21;
  if (WVar1 != MacStyle) {
    iVar30 = 0;
  }
  QFrame::setFrameStyle(this->pageFrame,iVar30);
  QFrame::setLineWidth(this->pageFrame,0);
  QFrame::setMidLineWidth(this->pageFrame,uVar28);
  right = uVar28;
  if (info->header == true) {
    if (WVar1 == ModernStyle) {
      uVar28 = uVar22;
      right = info->topLevelMarginLeft;
    }
    else {
      right = iVar20 + 4;
      if (WVar1 != ClassicStyle) {
        right = uVar28;
      }
    }
  }
  uVar22 = 0x12;
  if (WVar1 != AeroStyle) {
    uVar22 = right;
  }
  QWidget::setContentsMargins(&this->pageFrame->super_QWidget,uVar22,uVar28,right,uVar28);
  if (((info->watermark != false) || (info->sideWidget == true)) &&
     (this->watermarkLabel == (QWatermarkLabel *)0x0)) {
    pQVar18 = (QWatermarkLabel *)operator_new(0x38);
    QWatermarkLabel::QWatermarkLabel
              (pQVar18,&this->antiFlickerWidget->super_QWidget,this->sideWidget);
    this->watermarkLabel = pQVar18;
    QWidget::setBackgroundRole((QWidget *)pQVar18,Base);
    QWidget::setMinimumHeight((QWidget *)this->watermarkLabel,1);
    QWidget::setSizePolicy((QWidget *)this->watermarkLabel,(QSizePolicy)0x700000);
    QLabel::setAlignment(&this->watermarkLabel->super_QLabel,(Alignment)0x21);
  }
  pQVar16 = QWidget::palette(&this->pageFrame->super_QWidget);
  QPalette::brush((ColorGroup)pQVar16,Dark);
  iVar20 = QColor::alpha();
  bVar19 = true;
  if (0xfe < iVar20) {
    pQVar16 = QWidget::palette(&this->pageFrame->super_QWidget);
    QPalette::brush((ColorGroup)pQVar16,Dark);
    iVar20 = QColor::alpha();
    bVar19 = iVar20 < 0xff;
  }
  if (WVar1 == MacStyle) {
    QWidget::setAutoFillBackground(&this->pageFrame->super_QWidget,true);
    QWidget::setAutoFillBackground(&this->antiFlickerWidget->super_QWidget,false);
  }
  else {
    if (bVar19) {
      pQVar15 = &this->pageFrame->super_QWidget;
      QPalette::QPalette((QPalette *)local_58);
      QWidget::setPalette(pQVar15,(QPalette *)local_58);
      QPalette::~QPalette((QPalette *)local_58);
    }
    bVar19 = (bool)((info->header ^ 1U) & WVar1 == ModernStyle);
    QWidget::setBackgroundRole(&this->pageFrame->super_QWidget,Window - bVar19);
    if ((QWidget *)this->titleLabel != (QWidget *)0x0) {
      QWidget::setAutoFillBackground((QWidget *)this->titleLabel,bVar19);
    }
    QWidget::setAutoFillBackground(&this->pageFrame->super_QWidget,bVar19);
    if (this->watermarkLabel != (QWatermarkLabel *)0x0) {
      QWidget::setAutoFillBackground((QWidget *)this->watermarkLabel,bVar19);
    }
    if (this->placeholderWidget1 != (QWidget *)0x0) {
      QWidget::setAutoFillBackground(this->placeholderWidget1,bVar19);
    }
    if (this->placeholderWidget2 != (QWidget *)0x0) {
      QWidget::setAutoFillBackground(this->placeholderWidget2,bVar19);
    }
    if (WVar1 == AeroStyle) {
      local_58 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      pQVar16 = QWidget::palette(&this->pageFrame->super_QWidget);
      QPalette::QPalette((QPalette *)local_58,pQVar16);
      local_88.cspec = Rgb;
      local_88.ct._0_4_ = 0xffffffff;
      local_88.ct._4_4_ = 0xffffffff;
      local_88.ct.argb.pad = 0;
      QBrush::QBrush((QBrush *)&local_68,&local_88,SolidPattern);
      CVar26 = (ColorGroup)(QPalette *)local_58;
      QPalette::setBrush(CVar26,Mid,(QBrush *)&DAT_0000000a);
      QBrush::~QBrush((QBrush *)&local_68);
      QWidget::setPalette(&this->pageFrame->super_QWidget,(QPalette *)local_58);
      QWidget::setAutoFillBackground(&this->pageFrame->super_QWidget,true);
      pQVar16 = QWidget::palette(&this->antiFlickerWidget->super_QWidget);
      QPalette::operator=((QPalette *)local_58,pQVar16);
      local_88.cspec = Rgb;
      local_88.ct._0_4_ = 0xffffffff;
      local_88.ct._4_4_ = 0xffffffff;
      local_88.ct.argb.pad = 0;
      QBrush::QBrush((QBrush *)&local_68,&local_88,SolidPattern);
      QPalette::setBrush(CVar26,Mid,(QBrush *)&DAT_0000000a);
      QBrush::~QBrush((QBrush *)&local_68);
      QWidget::setPalette(&this->antiFlickerWidget->super_QWidget,(QPalette *)local_58);
      QWidget::setAutoFillBackground(&this->antiFlickerWidget->super_QWidget,true);
      QPalette::~QPalette((QPalette *)local_58);
    }
  }
  iVar20 = iVar23 + 1;
  QGridLayout::addWidget
            (this->mainLayout,&this->pageFrame->super_QWidget,iVar23,iVar29,(Alignment)0x0);
  iVar29 = iVar20;
  if (WVar1 == ClassicStyle) {
    iVar29 = iVar23 + 2;
    QGridLayout::setRowMinimumHeight(this->mainLayout,iVar20,iVar21);
  }
  if (WVar1 == AeroStyle) {
    QLayout::setContentsMargins((QLayout *)this->buttonLayout,9,9,9,9);
    QLayout::setContentsMargins(&this->mainLayout->super_QLayout,0,0xb,0,0);
  }
  bVar19 = info->extension;
  if (bVar19 != false) {
    columnSpan = 1;
  }
  iVar23 = iVar29;
  if (WVar1 < MacStyle) {
    if (this->bottomRuler == (QWizardRuler *)0x0) {
      pQVar15 = (QWidget *)operator_new(0x60);
      QWidget::QWidget(pQVar15,&this->antiFlickerWidget->super_QWidget,(WindowFlags)0x0);
      *(undefined ***)pQVar15 = &PTR_metaObject_00813498;
      *(undefined ***)&pQVar15->super_QPaintDevice = &PTR__QWizardHeader_00813648;
      QPixmap::QPixmap((QPixmap *)&pQVar15[1].data);
      QWidget::setFixedHeight(pQVar15,2);
      *(undefined ***)pQVar15 = &PTR_metaObject_00814108;
      *(undefined ***)&pQVar15->super_QPaintDevice = &PTR__QWizardRuler_008142b8;
      this->bottomRuler = (QWizardRuler *)pQVar15;
    }
    iVar23 = iVar29 + 1;
    QGridLayout::addWidget
              (this->mainLayout,(QWidget *)this->bottomRuler,iVar29,(uint)bVar19,1,columnSpan,
               (Alignment)0x0);
  }
  iVar29 = iVar23;
  if (WVar1 == ClassicStyle) {
    iVar29 = iVar23 + 1;
    QGridLayout::setRowMinimumHeight(this->mainLayout,iVar23,iVar21);
  }
  QGridLayout::addLayout
            (this->mainLayout,(QLayout *)this->buttonLayout,iVar29,(uint)bVar19,1,columnSpan,
             (Alignment)0x0);
  if ((info->watermark != false) || (info->sideWidget == true)) {
    if (info->extension != false) {
      iVar20 = iVar29 + 1;
    }
    QGridLayout::addWidget
              (this->mainLayout,(QWidget *)this->watermarkLabel,iVar10,0,iVar20 - iVar10,1,
               (Alignment)0x0);
  }
  iVar10 = 0xb5;
  if ((info->watermark & 1U) != 0) {
    iVar10 = 0;
  }
  if (WVar1 != MacStyle) {
    iVar10 = 0;
  }
  QGridLayout::setColumnMinimumWidth(this->mainLayout,0,iVar10);
  if (WVar1 == MacStyle) {
    QGridLayout::setColumnMinimumWidth(this->mainLayout,2,0x15);
  }
  pQVar14 = this->headerWidget;
  if (pQVar14 != (QWizardHeader *)0x0) {
    (**(code **)(*(long *)&pQVar14->super_QWidget + 0x68))(pQVar14,info->header);
  }
  pQVar17 = this->titleLabel;
  if (pQVar17 != (QLabel *)0x0) {
    (**(code **)(*(long *)&(pQVar17->super_QFrame).super_QWidget + 0x68))(pQVar17,info->title);
  }
  pQVar17 = this->subTitleLabel;
  if (pQVar17 != (QLabel *)0x0) {
    (**(code **)(*(long *)&(pQVar17->super_QFrame).super_QWidget + 0x68))(pQVar17,info->subTitle);
  }
  pQVar3 = this->bottomRuler;
  if (pQVar3 != (QWizardRuler *)0x0) {
    (**(code **)(*(long *)&(pQVar3->super_QWizardHeader).super_QWidget + 0x68))
              (pQVar3,WVar1 < MacStyle);
  }
  pQVar18 = this->watermarkLabel;
  if (pQVar18 != (QWatermarkLabel *)0x0) {
    (**(code **)(*(long *)&(pQVar18->super_QLabel).super_QFrame.super_QWidget + 0x68))
              (pQVar18,(info->sideWidget | info->watermark) & 1);
  }
  *(undefined8 *)((long)&(this->layoutInfo).wizStyle + 2) =
       *(undefined8 *)((long)&info->wizStyle + 2);
  iVar10 = info->topLevelMarginLeft;
  iVar20 = info->topLevelMarginRight;
  iVar21 = info->topLevelMarginTop;
  iVar23 = info->topLevelMarginBottom;
  iVar29 = info->childMarginLeft;
  iVar30 = info->childMarginRight;
  iVar24 = info->childMarginTop;
  iVar4 = info->childMarginBottom;
  iVar5 = info->vspacing;
  iVar6 = info->buttonSpacing;
  WVar1 = info->wizStyle;
  (this->layoutInfo).hspacing = info->hspacing;
  (this->layoutInfo).vspacing = iVar5;
  (this->layoutInfo).buttonSpacing = iVar6;
  (this->layoutInfo).wizStyle = WVar1;
  (this->layoutInfo).childMarginLeft = iVar29;
  (this->layoutInfo).childMarginRight = iVar30;
  (this->layoutInfo).childMarginTop = iVar24;
  (this->layoutInfo).childMarginBottom = iVar4;
  (this->layoutInfo).topLevelMarginLeft = iVar10;
  (this->layoutInfo).topLevelMarginRight = iVar20;
  (this->layoutInfo).topLevelMarginTop = iVar21;
  (this->layoutInfo).topLevelMarginBottom = iVar23;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWizardPrivate::recreateLayout(const QWizardLayoutInfo &info)
{
    Q_Q(QWizard);

    /*
        Start by undoing the main layout.
    */
    for (int i = mainLayout->count() - 1; i >= 0; --i) {
        QLayoutItem *item = mainLayout->takeAt(i);
        if (item->layout()) {
            item->layout()->setParent(nullptr);
        } else {
            delete item;
        }
    }
    for (int i = mainLayout->columnCount() - 1; i >= 0; --i)
        mainLayout->setColumnMinimumWidth(i, 0);
    for (int i = mainLayout->rowCount() - 1; i >= 0; --i)
        mainLayout->setRowMinimumHeight(i, 0);

    /*
        Now, recreate it.
    */

    bool mac = (info.wizStyle == QWizard::MacStyle);
    bool classic = (info.wizStyle == QWizard::ClassicStyle);
    bool modern = (info.wizStyle == QWizard::ModernStyle);
    bool aero = (info.wizStyle == QWizard::AeroStyle);
    int deltaMarginLeft = info.topLevelMarginLeft - info.childMarginLeft;
    int deltaMarginRight = info.topLevelMarginRight - info.childMarginRight;
    int deltaMarginTop = info.topLevelMarginTop - info.childMarginTop;
    int deltaMarginBottom = info.topLevelMarginBottom - info.childMarginBottom;
    int deltaVSpacing = info.topLevelMarginBottom - info.vspacing;

    int row = 0;
    int numColumns;
    if (mac) {
        numColumns = 3;
    } else if (info.watermark || info.sideWidget) {
        numColumns = 2;
    } else {
        numColumns = 1;
    }
    int pageColumn = qMin(1, numColumns - 1);

    if (mac) {
        mainLayout->setContentsMargins(QMargins());
        mainLayout->setSpacing(0);
        buttonLayout->setContentsMargins(MacLayoutLeftMargin, MacButtonTopMargin, MacLayoutRightMargin, MacLayoutBottomMargin);
        pageVBoxLayout->setContentsMargins(7, 7, 7, 7);
    } else {
        if (modern) {
            mainLayout->setContentsMargins(QMargins());
            mainLayout->setSpacing(0);
            pageVBoxLayout->setContentsMargins(deltaMarginLeft, deltaMarginTop,
                                               deltaMarginRight, deltaMarginBottom);
            buttonLayout->setContentsMargins(info.topLevelMarginLeft, info.topLevelMarginTop,
                                             info.topLevelMarginRight, info.topLevelMarginBottom);
        } else {
            mainLayout->setContentsMargins(info.topLevelMarginLeft, info.topLevelMarginTop,
                                           info.topLevelMarginRight, info.topLevelMarginBottom);
            mainLayout->setHorizontalSpacing(info.hspacing);
            mainLayout->setVerticalSpacing(info.vspacing);
            pageVBoxLayout->setContentsMargins(0, 0, 0, 0);
            buttonLayout->setContentsMargins(0, 0, 0, 0);
        }
    }
    buttonLayout->setSpacing(info.buttonSpacing);

    if (info.header) {
        if (!headerWidget)
            headerWidget = new QWizardHeader(antiFlickerWidget);
        headerWidget->setAutoFillBackground(modern);
        mainLayout->addWidget(headerWidget, row++, 0, 1, numColumns);
    }
    if (headerWidget)
        headerWidget->setVisible(info.header);

    int watermarkStartRow = row;

    if (mac)
        mainLayout->setRowMinimumHeight(row++, 10);

    if (info.title) {
        if (!titleLabel) {
            titleLabel = new QLabel(antiFlickerWidget);
            titleLabel->setBackgroundRole(QPalette::Base);
            titleLabel->setWordWrap(true);
        }

        QFont titleFont = q->font();
        titleFont.setPointSize(titleFont.pointSize() + (mac ? 3 : 4));
        titleFont.setBold(true);
        titleLabel->setPalette(QPalette());

        if (aero) {
            // ### hardcoded for now:
            titleFont = QFont("Segoe UI"_L1, 12);
            QPalette pal(titleLabel->palette());
            pal.setColor(QPalette::Text, QColor(0x00, 0x33, 0x99));
            titleLabel->setPalette(pal);
        }

        titleLabel->setFont(titleFont);
        const int aeroTitleIndent = 25; // ### hardcoded for now - should be calculated somehow
        if (aero)
            titleLabel->setIndent(aeroTitleIndent);
        else if (mac)
            titleLabel->setIndent(2);
        else if (classic)
            titleLabel->setIndent(info.childMarginLeft);
        else
            titleLabel->setIndent(info.topLevelMarginLeft);
        if (modern) {
            if (!placeholderWidget1) {
                placeholderWidget1 = new QWidget(antiFlickerWidget);
                placeholderWidget1->setBackgroundRole(QPalette::Base);
            }
            placeholderWidget1->setFixedHeight(info.topLevelMarginLeft + 2);
            mainLayout->addWidget(placeholderWidget1, row++, pageColumn);
        }
        mainLayout->addWidget(titleLabel, row++, pageColumn);
        if (modern) {
            if (!placeholderWidget2) {
                placeholderWidget2 = new QWidget(antiFlickerWidget);
                placeholderWidget2->setBackgroundRole(QPalette::Base);
            }
            placeholderWidget2->setFixedHeight(5);
            mainLayout->addWidget(placeholderWidget2, row++, pageColumn);
        }
        if (mac)
            mainLayout->setRowMinimumHeight(row++, 7);
    }
    if (placeholderWidget1)
        placeholderWidget1->setVisible(info.title && modern);
    if (placeholderWidget2)
        placeholderWidget2->setVisible(info.title && modern);

    if (info.subTitle) {
        if (!subTitleLabel) {
            subTitleLabel = new QLabel(pageFrame);
            subTitleLabel->setWordWrap(true);

            subTitleLabel->setContentsMargins(info.childMarginLeft , 0,
                                              info.childMarginRight , 0);

            pageVBoxLayout->insertWidget(1, subTitleLabel);
        }
    }

    // ### try to replace with margin.
    changeSpacerSize(pageVBoxLayout, 0, 0, info.subTitle ? info.childMarginLeft : 0);

    int hMargin = mac ? 1 : 0;
    int vMargin = hMargin;

    pageFrame->setFrameStyle(mac ? (QFrame::Box | QFrame::Raised) : QFrame::NoFrame);
    pageFrame->setLineWidth(0);
    pageFrame->setMidLineWidth(hMargin);

    if (info.header) {
        if (modern) {
            hMargin = info.topLevelMarginLeft;
            vMargin = deltaMarginBottom;
        } else if (classic) {
            hMargin = deltaMarginLeft + ClassicHMargin;
            vMargin = 0;
        }
    }

    if (aero) {
        int leftMargin   = 18; // ### hardcoded for now - should be calculated somehow
        int topMargin    = vMargin;
        int rightMargin  = hMargin; // ### for now
        int bottomMargin = vMargin;
        pageFrame->setContentsMargins(leftMargin, topMargin, rightMargin, bottomMargin);
    } else {
        pageFrame->setContentsMargins(hMargin, vMargin, hMargin, vMargin);
    }

    if ((info.watermark || info.sideWidget) && !watermarkLabel) {
        watermarkLabel = new QWatermarkLabel(antiFlickerWidget, sideWidget);
        watermarkLabel->setBackgroundRole(QPalette::Base);
        watermarkLabel->setMinimumHeight(1);
        watermarkLabel->setSizePolicy(QSizePolicy::Fixed, QSizePolicy::Expanding);
        watermarkLabel->setAlignment(Qt::AlignLeft | Qt::AlignTop);
    }

    //bool wasSemiTransparent = pageFrame->testAttribute(Qt::WA_SetPalette);
    const bool wasSemiTransparent =
        pageFrame->palette().brush(QPalette::Window).color().alpha() < 255
        || pageFrame->palette().brush(QPalette::Base).color().alpha() < 255;
    if (mac) {
        pageFrame->setAutoFillBackground(true);
        antiFlickerWidget->setAutoFillBackground(false);
    } else {
        if (wasSemiTransparent)
            pageFrame->setPalette(QPalette());

        bool baseBackground = (modern && !info.header); // ### TAG1
        pageFrame->setBackgroundRole(baseBackground ? QPalette::Base : QPalette::Window);

        if (titleLabel)
            titleLabel->setAutoFillBackground(baseBackground);
        pageFrame->setAutoFillBackground(baseBackground);
        if (watermarkLabel)
            watermarkLabel->setAutoFillBackground(baseBackground);
        if (placeholderWidget1)
            placeholderWidget1->setAutoFillBackground(baseBackground);
        if (placeholderWidget2)
            placeholderWidget2->setAutoFillBackground(baseBackground);

        if (aero) {
            QPalette pal = pageFrame->palette();
            pal.setBrush(QPalette::Window, QColor(255, 255, 255));
            pageFrame->setPalette(pal);
            pageFrame->setAutoFillBackground(true);
            pal = antiFlickerWidget->palette();
            pal.setBrush(QPalette::Window, QColor(255, 255, 255));
            antiFlickerWidget->setPalette(pal);
            antiFlickerWidget->setAutoFillBackground(true);
        }
    }

    mainLayout->addWidget(pageFrame, row++, pageColumn);

    int watermarkEndRow = row;
    if (classic)
        mainLayout->setRowMinimumHeight(row++, deltaVSpacing);

    if (aero) {
        buttonLayout->setContentsMargins(9, 9, 9, 9);
        mainLayout->setContentsMargins(0, 11, 0, 0);
    }

    int buttonStartColumn = info.extension ? 1 : 0;
    int buttonNumColumns = info.extension ? 1 : numColumns;

    if (classic || modern) {
        if (!bottomRuler)
            bottomRuler = new QWizardRuler(antiFlickerWidget);
        mainLayout->addWidget(bottomRuler, row++, buttonStartColumn, 1, buttonNumColumns);
    }

    if (classic)
        mainLayout->setRowMinimumHeight(row++, deltaVSpacing);

    mainLayout->addLayout(buttonLayout, row++, buttonStartColumn, 1, buttonNumColumns);

    if (info.watermark || info.sideWidget) {
        if (info.extension)
            watermarkEndRow = row;
        mainLayout->addWidget(watermarkLabel, watermarkStartRow, 0,
                              watermarkEndRow - watermarkStartRow, 1);
    }

    mainLayout->setColumnMinimumWidth(0, mac && !info.watermark ? 181 : 0);
    if (mac)
        mainLayout->setColumnMinimumWidth(2, 21);

    if (headerWidget)
        headerWidget->setVisible(info.header);
    if (titleLabel)
        titleLabel->setVisible(info.title);
    if (subTitleLabel)
        subTitleLabel->setVisible(info.subTitle);
    if (bottomRuler)
        bottomRuler->setVisible(classic || modern);
    if (watermarkLabel)
        watermarkLabel->setVisible(info.watermark || info.sideWidget);

    layoutInfo = info;
}